

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.c
# Opt level: O3

int enet_host_compress_with_range_coder(ENetHost *host)

{
  int iVar1;
  ENetCompressor local_28;
  
  local_28.context = enet_malloc(0x10000);
  if (local_28.context == (void *)0x0) {
    iVar1 = -1;
  }
  else {
    local_28.compress = enet_range_coder_compress;
    local_28.decompress = enet_range_coder_decompress;
    local_28.destroy = enet_range_coder_destroy;
    enet_host_compress(host,&local_28);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
enet_host_compress_with_range_coder (ENetHost * host)
{
    ENetCompressor compressor;
    memset (& compressor, 0, sizeof (compressor));
    compressor.context = enet_range_coder_create();
    if (compressor.context == NULL)
      return -1;
    compressor.compress = enet_range_coder_compress;
    compressor.decompress = enet_range_coder_decompress;
    compressor.destroy = enet_range_coder_destroy;
    enet_host_compress (host, & compressor);
    return 0;
}